

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

StringPtr *
kj::_::
CopyConstructArray_<kj::HashMap<kj::String,_int>::Entry,_kj::HashMap<kj::String,_int>::Entry_*,_true,_false>
::apply(StringPtr *pos,StringPtr *start,StringPtr *end)

{
  StringPtr *params;
  StringPtr *end_local;
  StringPtr *start_local;
  StringPtr *pos_local;
  
  end_local = start;
  start_local = pos;
  while (end_local != end) {
    params = mv<kj::HashMap<kj::String,int>::Entry>(end_local);
    ctor<kj::HashMap<kj::String,int>::Entry,kj::HashMap<kj::String,int>::Entry>(start_local,params);
    end_local = end_local + 2;
    start_local = start_local + 2;
  }
  return start_local;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }